

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcLaborResource::IfcLaborResource(IfcLaborResource *this)

{
  *(undefined ***)&this->field_0x1b0 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0x1b8 = 0;
  *(char **)&this->field_0x1c0 = "IfcLaborResource";
  IfcConstructionResource::IfcConstructionResource
            (&this->super_IfcConstructionResource,&PTR_construction_vtable_24__00864900);
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x180 = 0;
  *(undefined8 *)&this->super_IfcConstructionResource = 0x8647f8;
  *(undefined8 *)&this->field_0x1b0 = 0x8648e8;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x88 = 0x864820;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x98 = 0x864848;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0xd0 = 0x864870;
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x864898;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x178 = 0x8648c0;
  *(undefined1 **)&(this->super_IfcConstructionResource).field_0x188 = &this->field_0x198;
  *(undefined8 *)&this->field_0x190 = 0;
  this->field_0x198 = 0;
  this->field_0x1a8 = 0;
  return;
}

Assistant:

IfcLaborResource() : Object("IfcLaborResource") {}